

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O0

void __thiscall ON_MD5::AccumulateBytes(ON_MD5 *this,void *buffer,ON__UINT64 sizeof_buffer)

{
  ON__UINT8 *local_30;
  ON__UINT8 *p;
  ON__UINT64 OStack_20;
  ON__UINT32 max_length;
  ON__UINT64 sizeof_buffer_local;
  void *buffer_local;
  ON_MD5 *this_local;
  
  if ((buffer != (void *)0x0) && (sizeof_buffer != 0)) {
    if ((this->m_status_bits & 1) != 1) {
      Reset(this);
    }
    this->m_status_bits = 1;
    this->m_byte_count = sizeof_buffer + this->m_byte_count;
    local_30 = (ON__UINT8 *)buffer;
    for (OStack_20 = sizeof_buffer; 0xfffffff < OStack_20; OStack_20 = OStack_20 - 0xfffffff) {
      Internal_Accumulate(this,local_30,0xfffffff);
      local_30 = local_30 + 0xfffffff;
    }
    Internal_Accumulate(this,local_30,(ON__UINT32)OStack_20);
  }
  return;
}

Assistant:

void ON_MD5::AccumulateBytes(
  const void* buffer,
  ON__UINT64 sizeof_buffer
  )
{
  if (nullptr != buffer && sizeof_buffer > 0)
  {
    if (1 != (1 & m_status_bits))
      Reset();
    m_status_bits = 1; // invalidate any intermediate cached m_digest value.
    m_byte_count += sizeof_buffer;
    const ON__UINT32 max_length = 0x0FFFFFFFU;
    const ON__UINT8* p = (const ON__UINT8*)buffer;
    while (sizeof_buffer > max_length)
    {
      Internal_Accumulate(p,max_length);
      sizeof_buffer -= max_length;
      p += max_length;
    }
    Internal_Accumulate(p,(ON__UINT32)sizeof_buffer);
  }
}